

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.h
# Opt level: O1

void __thiscall
Js::ActivationObjectEx::ActivationObjectEx
          (ActivationObjectEx *this,DynamicType *type,ScriptFunction *func,uint cachedFuncCount,
          uint firstFuncSlot,uint lastFuncSlot)

{
  DynamicObject::DynamicObject((DynamicObject *)this,type,true);
  (this->super_ActivationObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_0154f810;
  Memory::Recycler::WBSetBit((char *)&this->parentFunc);
  (this->parentFunc).ptr = func;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->parentFunc);
  this->cachedFuncCount = cachedFuncCount;
  this->firstFuncSlot = firstFuncSlot;
  this->lastFuncSlot = lastFuncSlot;
  this->committed = false;
  this->cache[0].func.ptr = (ScriptFunction *)0x0;
  this->cache[0].type.ptr = (DynamicType *)0x0;
  if (cachedFuncCount != 0) {
    this->cache[0].func.ptr = (ScriptFunction *)0x0;
  }
  return;
}

Assistant:

ActivationObjectEx(
            DynamicType * type, ScriptFunction *func, uint cachedFuncCount, uint firstFuncSlot, uint lastFuncSlot)
            : ActivationObject(type),
              parentFunc(func),
              cachedFuncCount(cachedFuncCount),
              firstFuncSlot(firstFuncSlot),
              lastFuncSlot(lastFuncSlot),
              committed(false)
        {
            if (cachedFuncCount != 0)
            {
                cache[0].func = nullptr;
            }
        }